

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phpconvert.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  AppParams *params;
  AppManager *this;
  ostream *poVar1;
  string local_e8;
  SystemException *e;
  exception *e_1;
  size_type sStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a8;
  undefined8 local_98;
  string sStack_90;
  undefined8 uStack_70;
  exception local_60 [8];
  exception ex;
  char *message;
  AppManager *app;
  AppParams *appParams;
  undefined1 local_30 [8];
  Bench b;
  char **argv_local;
  int argc_local;
  
  b.stop = (double)argv;
  phpconvert::Bench::Bench((Bench *)local_30);
  phpconvert::Bench::setStart((Bench *)local_30);
  std::exception::exception(local_60);
  sStack_90.field_2._8_8_ = 0;
  uStack_70._0_1_ = false;
  uStack_70._1_7_ = 0;
  sStack_90._M_string_length = 0;
  sStack_90.field_2._M_allocated_capacity = 0;
  local_98._0_1_ = false;
  local_98._1_7_ = 0;
  sStack_90._M_dataplus = (_Alloc_hider)0x0;
  sStack_90._1_7_ = 0;
  local_a8._M_allocated_capacity = 0;
  local_a8._8_8_ = 0;
  e_1 = (exception *)0x0;
  sStack_b0 = 0;
  phpconvert::AppParams::AppParams((AppParams *)&e_1);
  params = phpconvert::AppParams::createFromRequest((AppParams *)&e_1,argc,(char **)b.stop);
  phpconvert::AppParams::~AppParams((AppParams *)&e_1);
  this = (AppManager *)operator_new(0x10);
  phpconvert::AppManager::AppManager(this);
  phpconvert::AppManager::run(this,params);
  std::operator<<((ostream *)&std::cout,_ex);
  if (params != (AppParams *)0x0) {
    phpconvert::AppParams::~AppParams(params);
    operator_delete(params);
  }
  if (this != (AppManager *)0x0) {
    (*this->_vptr_AppManager[1])();
  }
  phpconvert::Bench::setStop((Bench *)local_30);
  phpconvert::Bench::getDiff_abi_cxx11_(&local_e8,(Bench *)local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_e8);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_e8);
  std::exception::~exception(local_60);
  phpconvert::Bench::~Bench((Bench *)local_30);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    Bench b;
    b.setStart();

    AppParams *appParams;
    AppManager *app;
    const char* message;
    exception ex;

    appParams = (AppParams()).createFromRequest(argc, argv);
    app = new AppManager();

    try {
        app->run(appParams);
    } catch (SystemException &e) {
        ex = e;
        message =  e.what();
    } catch (exception &e) { //ooopss ;)
        ex = e;
        message =   e.what();
    }

    cout << message;

    delete appParams;
    delete app;
//    delete message;

    b.setStop();
    cout << b.getDiff() << "\n";
    return 0;
}